

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O3

void connection_fail(uv_connect_cb connect_cb)

{
  int iVar1;
  uv_loop_t *puVar2;
  int iVar3;
  sockaddr_in *addr;
  char *pcVar4;
  uv_connect_t *loop;
  uv_tcp_t *puVar5;
  sockaddr_in server_addr;
  sockaddr_in client_addr;
  sockaddr_in sStack_28;
  sockaddr_in local_18;
  
  pcVar4 = "0.0.0.0";
  iVar3 = 0;
  iVar1 = uv_ip4_addr("0.0.0.0",0,&local_18);
  if (iVar1 == 0) {
    loop = (uv_connect_t *)0x1a4b3a;
    iVar3 = 0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_28);
    if (iVar1 != 0) goto LAB_0014afb9;
    loop = (uv_connect_t *)uv_default_loop();
    iVar3 = 0x2f87f0;
    iVar1 = uv_tcp_init((uv_loop_t *)loop,&tcp);
    if (iVar1 != 0) goto LAB_0014afbe;
    puVar5 = &tcp;
    addr = &local_18;
    iVar1 = uv_tcp_bind(&tcp,(sockaddr *)addr,0);
    iVar3 = (int)addr;
    loop = (uv_connect_t *)puVar5;
    if (iVar1 != 0) goto LAB_0014afc3;
    loop = &req;
    iVar3 = 0x2f87f0;
    iVar1 = uv_tcp_connect(&req,&tcp,(sockaddr *)&sStack_28,connect_cb);
    if (iVar1 != 0) goto LAB_0014afc8;
    loop = (uv_connect_t *)uv_default_loop();
    iVar3 = 0;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (connect_cb_calls != 1) goto LAB_0014afcd;
    if (close_cb_calls == 1) {
      return;
    }
  }
  else {
    connection_fail_cold_1();
    loop = (uv_connect_t *)pcVar4;
LAB_0014afb9:
    connection_fail_cold_2();
LAB_0014afbe:
    connection_fail_cold_3();
LAB_0014afc3:
    connection_fail_cold_4();
LAB_0014afc8:
    connection_fail_cold_5();
LAB_0014afcd:
    connection_fail_cold_6();
  }
  connection_fail_cold_7();
  if ((uv_tcp_t *)((uv_loop_t *)loop)->pending_queue[0] == &tcp) {
    if (iVar3 != -0x6f) goto LAB_0014b012;
    connect_cb_calls = connect_cb_calls + 1;
    if (close_cb_calls == 0) {
      uv_close((uv_handle_t *)&tcp,on_close);
      return;
    }
  }
  else {
    on_connect_with_close_cold_1();
LAB_0014b012:
    on_connect_with_close_cold_2();
  }
  on_connect_with_close_cold_3();
  puVar2 = uv_default_loop();
  iVar3 = 0x2f8758;
  iVar1 = uv_timer_init(puVar2,&timer);
  if (iVar1 == 0) {
    connection_fail(on_connect_without_close);
    if (timer_close_cb_calls != 1) goto LAB_0014b090;
    if (timer_cb_calls == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      iVar3 = 0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0014b09a;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_0014b090:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_0014b09a:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar3 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return;
}

Assistant:

static void connection_fail(uv_connect_cb connect_cb) {
  struct sockaddr_in client_addr, server_addr;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", 0, &client_addr));

  /* There should be no servers listening on this port. */
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway. so these
   * handles can be pre-initialized. */
  ASSERT(0 == uv_tcp_bind(&tcp, (const struct sockaddr*) &client_addr, 0));

  r = uv_tcp_connect(&req,
                     &tcp,
                     (const struct sockaddr*) &server_addr,
                     connect_cb);
  ASSERT(!r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_calls == 1);
  ASSERT(close_cb_calls == 1);
}